

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

AutoCloseFd __thiscall kj::anon_unknown_8::DiskFilesystem::openDir(DiskFilesystem *this,char *dir)

{
  int iVar1;
  int iVar2;
  Fault f;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  do {
    iVar1 = open(dir,0x90000);
    if (-1 < iVar1) {
      iVar2 = 0;
      break;
    }
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 == 0) {
    *(int *)&(this->super_Filesystem)._vptr_Filesystem = iVar1;
    UnwindDetector::UnwindDetector
              ((UnwindDetector *)((long)&(this->super_Filesystem)._vptr_Filesystem + 4));
    return (AutoCloseFd)this;
  }
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  kj::_::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

static AutoCloseFd openDir(const char* dir) {
    int newFd;
    KJ_SYSCALL(newFd = open(dir, O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY));
    AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif
    return result;
  }